

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_60e82::ShellTool::configureAttribute
          (ShellTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  ConfigureContext *pCVar1;
  bool bVar2;
  bool bVar3;
  bool local_499;
  bool local_429;
  Twine local_410;
  Twine local_3f8;
  Twine local_3e0;
  char *local_3c8 [2];
  ShellTool *local_3b8;
  char *local_3b0;
  Twine local_3a8;
  Twine local_390;
  Twine local_378;
  Twine local_360;
  Twine local_348;
  Twine local_330;
  Twine local_318;
  char *local_300 [2];
  ShellTool *local_2f0;
  char *local_2e8;
  char *local_2e0 [2];
  ShellTool *local_2d0;
  char *local_2c8;
  char *local_2c0 [2];
  char *local_2b0;
  size_t local_2a8;
  ConfigureContext *local_2a0;
  ConfigureContext *ctx_local;
  ShellTool *this_local;
  StringRef value_local;
  StringRef name_local;
  ShellTool *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  ShellTool *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  ShellTool *local_168;
  char *local_160;
  char *local_158;
  size_t local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  size_t local_130;
  char **local_128;
  char *local_120;
  size_t local_118;
  ShellTool **local_110;
  char *local_108;
  char *local_100;
  ShellTool **local_f8;
  char *local_f0;
  char *local_e8;
  ShellTool **local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  ShellTool *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  ShellTool *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  ShellTool *local_78;
  int local_6c;
  size_t local_68;
  char *local_60;
  char *local_58;
  int local_4c;
  char *local_48;
  char **local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  value_local.Data = (char *)value.Length;
  this_local = (ShellTool *)value.Data;
  local_2a8 = name.Length;
  local_2b0 = name.Data;
  local_40 = local_2c0;
  local_48 = "control-enabled";
  local_2c0[0] = "control-enabled";
  local_2a0 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_2b0;
  local_150 = strlen("control-enabled");
  local_138 = local_2b0;
  local_130 = local_2a8;
  local_148 = local_2c0[0];
  local_158 = local_2c0[0];
  local_120 = local_2c0[0];
  local_128 = &local_138;
  local_429 = false;
  local_140 = local_150;
  local_118 = local_150;
  if (local_2a8 == local_150) {
    local_58 = local_2b0;
    local_60 = local_2c0[0];
    local_68 = local_150;
    if (local_150 == 0) {
      local_4c = 0;
    }
    else {
      local_4c = memcmp(local_2b0,local_2c0[0],local_150);
    }
    local_429 = local_4c == 0;
  }
  pCVar1 = local_2a0;
  if (local_429) {
    local_2d0 = this_local;
    local_2c8 = value_local.Data;
    local_30 = local_2e0;
    local_38 = "true";
    local_2e0[0] = "true";
    local_d0 = (char *)strlen("true");
    local_1c8 = local_2d0;
    local_1c0 = local_2c8;
    local_d8 = local_2e0[0];
    local_e0 = &local_1c8;
    bVar2 = false;
    if (local_2c8 == local_d0) {
      local_b8 = local_2d0;
      local_c0 = local_2e0[0];
      local_c8 = local_d0;
      if (local_d0 == (char *)0x0) {
        local_ac = 0;
      }
      else {
        local_ac = memcmp(local_2d0,local_2e0[0],(size_t)local_d0);
      }
      bVar2 = local_ac == 0;
    }
    bVar3 = false;
    if (!bVar2) {
      local_2f0 = this_local;
      local_2e8 = value_local.Data;
      local_20 = local_300;
      local_28 = "false";
      local_300[0] = "false";
      local_1b0 = (char *)strlen("false");
      local_198 = local_2f0;
      local_190 = local_2e8;
      local_1a8 = local_300[0];
      local_1b8 = local_300[0];
      local_f0 = local_300[0];
      local_f8 = &local_198;
      bVar3 = false;
      local_1a0 = local_1b0;
      local_e8 = local_1b0;
      if (local_2e8 == local_1b0) {
        local_98 = local_2f0;
        local_a0 = local_300[0];
        local_a8 = local_1b0;
        if (local_1b0 == (char *)0x0) {
          local_8c = 0;
        }
        else {
          local_8c = memcmp(local_2f0,local_300[0],(size_t)local_1b0);
        }
        bVar3 = local_8c == 0;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    pCVar1 = local_2a0;
    if (bVar3) {
      llvm::operator+(&local_360,"invalid value: \'",(StringRef *)&this_local);
      llvm::Twine::Twine(&local_378,"\' for attribute \'");
      llvm::operator+(&local_348,&local_360,&local_378);
      llvm::Twine::Twine(&local_390,(StringRef *)&value_local.Length);
      llvm::operator+(&local_330,&local_348,&local_390);
      llvm::Twine::Twine(&local_3a8,"\'");
      llvm::operator+(&local_318,&local_330,&local_3a8);
      llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_318);
      name_local.Length._7_1_ = false;
    }
    else {
      local_3b8 = this_local;
      local_3b0 = value_local.Data;
      local_10 = local_3c8;
      local_18 = "true";
      local_3c8[0] = "true";
      local_180 = (char *)strlen("true");
      local_168 = local_3b8;
      local_160 = local_3b0;
      local_178 = local_3c8[0];
      local_188 = local_3c8[0];
      local_108 = local_3c8[0];
      local_110 = &local_168;
      local_499 = false;
      if (local_3b0 == local_180) {
        local_78 = local_3b8;
        local_80 = local_3c8[0];
        if (local_180 == (char *)0x0) {
          local_6c = 0;
        }
        else {
          local_170 = local_180;
          local_100 = local_180;
          local_88 = local_180;
          local_6c = memcmp(local_3b8,local_3c8[0],(size_t)local_180);
        }
        local_499 = local_6c == 0;
      }
      this->controlEnabled = local_499;
      name_local.Length._7_1_ = true;
    }
  }
  else {
    llvm::operator+(&local_3f8,"unexpected attribute: \'",(StringRef *)&value_local.Length);
    llvm::Twine::Twine(&local_410,"\'");
    llvm::operator+(&local_3e0,&local_3f8,&local_410);
    llbuild::buildsystem::ConfigureContext::error(pCVar1,&local_3e0);
    name_local.Length._7_1_ = false;
  }
  return name_local.Length._7_1_;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "control-enabled") {
      if (value != "true" && value != "false") {
        ctx.error("invalid value: '" + value + "' for attribute '" +
                  name + "'");
        return false;
      }
      controlEnabled = (value == "true");
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
    return true;
  }